

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceVertexTangentVectorQuantity::SurfaceVertexTangentVectorQuantity
          (SurfaceVertexTangentVectorQuantity *this,string *name,
          vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          *vectors_,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *basisX_,vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *basisY_,SurfaceMesh *mesh_,int nSym_,VectorType vectorType_)

{
  string *in_RSI;
  undefined8 *in_RDI;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *in_stack_000000b8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_000000c0;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_000000c8;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *in_stack_000000d0;
  SurfaceVertexTangentVectorQuantity *in_stack_000000d8;
  TangentVectorQuantity<polyscope::SurfaceVertexTangentVectorQuantity> *in_stack_000000e0;
  int in_stack_000000f0;
  VectorType in_stack_000000f8;
  MeshElement in_stack_ffffffffffffffac;
  SurfaceMesh *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  SurfaceVectorQuantity *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI);
  SurfaceVectorQuantity::SurfaceVectorQuantity
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffac);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  *in_RDI = &PTR__SurfaceVertexTangentVectorQuantity_0098d6a0;
  TangentVectorQuantity<polyscope::SurfaceVertexTangentVectorQuantity>::TangentVectorQuantity
            (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
             in_stack_000000c0,in_stack_000000b8,in_stack_000000f0,in_stack_000000f8);
  *in_RDI = &PTR__SurfaceVertexTangentVectorQuantity_0098d6a0;
  return;
}

Assistant:

SurfaceVertexTangentVectorQuantity::SurfaceVertexTangentVectorQuantity(
    std::string name, std::vector<glm::vec2> vectors_, std::vector<glm::vec3> basisX_, std::vector<glm::vec3> basisY_,
    SurfaceMesh& mesh_, int nSym_, VectorType vectorType_)
    : SurfaceVectorQuantity(name, mesh_, MeshElement::VERTEX),
      TangentVectorQuantity<SurfaceVertexTangentVectorQuantity>(*this, vectors_, basisX_, basisY_,
                                                                parent.vertexPositions, nSym_, vectorType_) {}